

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

int64_t __thiscall minja::Value::to_int(Value *this)

{
  bool bVar1;
  Value *in_RDI;
  double dVar2;
  Value *unaff_retaddr;
  exception *anon_var_0;
  Value *in_stack_00000018;
  size_t *in_stack_ffffffffffffffa8;
  string local_30 [40];
  long local_8;
  
  bVar1 = is_null(in_RDI);
  if (bVar1) {
    local_8 = 0;
  }
  else {
    bVar1 = is_boolean((Value *)0x2ad376);
    if (bVar1) {
      bVar1 = get<bool>(unaff_retaddr);
      local_8 = (long)(int)(uint)bVar1;
    }
    else {
      bVar1 = is_number((Value *)0x2ad3ab);
      if (bVar1) {
        dVar2 = get<double>(unaff_retaddr);
        local_8 = (long)dVar2;
      }
      else {
        bVar1 = is_string((Value *)0x2ad3d4);
        if (bVar1) {
          get<std::__cxx11::string>(in_stack_00000018);
          local_8 = std::__cxx11::stol((string *)in_RDI,in_stack_ffffffffffffffa8,0);
          std::__cxx11::string::~string(local_30);
        }
        else {
          local_8 = 0;
        }
      }
    }
  }
  return local_8;
}

Assistant:

int64_t to_int() const {
    if (is_null()) return 0;
    if (is_boolean()) return get<bool>() ? 1 : 0;
    if (is_number()) return static_cast<int64_t>(get<double>());
    if (is_string()) {
      try {
        return std::stol(get<std::string>());
      } catch (const std::exception &) {
        return 0;
      }
    }
    return 0;
  }